

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeinject.hh
# Opt level: O1

void __thiscall InjectPayload::~InjectPayload(InjectPayload *this)

{
  pointer pcVar1;
  
  this->_vptr_InjectPayload = (_func_int **)&PTR__InjectPayload_003c4268;
  std::vector<InjectParameter,_std::allocator<InjectParameter>_>::~vector(&this->output);
  std::vector<InjectParameter,_std::allocator<InjectParameter>_>::~vector(&this->inputlist);
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

InjectParameter &getOutput(int4 i) { return output[i]; }